

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O3

void __thiscall t_d_generator::~t_d_generator(t_d_generator *this)

{
  pointer pcVar1;
  
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_d_generator_0040f6e0;
  pcVar1 = (this->package_dir_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->package_dir_).field_2) {
    operator_delete(pcVar1);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_header_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_header_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_types_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_types_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x98);
  t_generator::~t_generator((t_generator *)this);
  operator_delete(this);
  return;
}

Assistant:

t_d_generator(t_program* program,
                const std::map<string, string>& parsed_options,
                const string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    /* no options yet */
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      throw "unknown option d:" + iter->first;
    }

    out_dir_base_ = "gen-d";
  }